

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O3

ssize_t __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::write
          (SplitBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  Node *pNVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  Node *pNVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  pNVar2 = this->lessThan;
  pNVar5 = this->greaterOrEqual;
  iVar1 = pNVar2->offset;
  if ((iVar1 < 0) &&
     ((iVar1 < pNVar5->offset || ((this->super_BranchNode).firstEdgeNumber < iVar1)))) {
    (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,plVar4);
    pNVar5 = this->greaterOrEqual;
  }
  (*(pNVar5->super_UObject)._vptr_UObject[5])(pNVar5,plVar4);
  (**(code **)(*plVar4 + 0x98))(plVar4,this->lessThan->offset);
  sVar3 = (**(code **)(*plVar4 + 0x78))(plVar4,*(undefined2 *)&(this->super_BranchNode).field_0x14);
  (this->super_BranchNode).super_Node.offset = (int32_t)sVar3;
  return sVar3;
}

Assistant:

void
StringTrieBuilder::SplitBranchNode::write(StringTrieBuilder &builder) {
    // Encode the less-than branch first.
    lessThan->writeUnlessInsideRightEdge(firstEdgeNumber, greaterOrEqual->getOffset(), builder);
    // Encode the greater-or-equal branch last because we do not jump for it at all.
    greaterOrEqual->write(builder);
    // Write this node.
    U_ASSERT(lessThan->getOffset()>0);
    builder.writeDeltaTo(lessThan->getOffset());  // less-than
    offset=builder.write(unit);
}